

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_ssadd16_sparc64(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined4 local_3c;
  long lStack_38;
  int r;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 2) {
    local_3c = (int)*(short *)((long)a + lStack_38) + (int)*(short *)((long)b + lStack_38);
    if (local_3c < 0x8000) {
      if (local_3c < -0x8000) {
        local_3c = -0x8000;
      }
    }
    else {
      local_3c._0_2_ = 0x7fff;
    }
    *(undefined2 *)((long)d + lStack_38) = (undefined2)local_3c;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_ssadd16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int r = *(int16_t *)((char *)a + i) + *(int16_t *)((char *)b + i);
        if (r > INT16_MAX) {
            r = INT16_MAX;
        } else if (r < INT16_MIN) {
            r = INT16_MIN;
        }
        *(int16_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}